

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O1

void scan_flux_mx(TrackData *trackdata,DataRate last_datarate)

{
  DataRate datarate_;
  void *pvVar1;
  pointer __src;
  pointer __dest;
  bool bVar2;
  FluxData *pFVar3;
  Track *this;
  int bitcell_ns;
  size_t __n;
  FluxData *pFVar4;
  FluxData *pFVar5;
  initializer_list<DataRate> __l;
  vector<DataRate,_std::allocator<DataRate>_> datarates;
  BitBuffer bitbuf;
  FluxDecoder decoder;
  pointer local_100;
  vector<DataRate,_std::allocator<DataRate>_> local_f8;
  DataRate local_dc;
  BitBuffer local_d8;
  FluxDecoder local_70;
  
  local_d8.encoding = 250000;
  local_d8.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 300000;
  __l._M_len = 3;
  __l._M_array = &local_d8.datarate;
  local_dc = last_datarate;
  local_d8.datarate = last_datarate;
  std::vector<DataRate,_std::allocator<DataRate>_>::vector
            (&local_f8,__l,(allocator_type *)&local_70);
  local_d8.datarate =
       (DataRate)
       local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.encoding =
       (Encoding)
       ((ulong)local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x20);
  local_70.m_flux_revs =
       (FluxData *)
       local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<DataRate*,std::vector<DataRate,std::allocator<DataRate>>>>,__gnu_cxx::__ops::_Iter_equals_val<DataRate_const>>
            (&local_100,&local_d8,&local_70,&local_dc);
  __src = local_100;
  __dest = local_100 + -1;
  if (local_100 !=
      local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __n = (long)local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)local_100;
    local_100 = __dest;
    memmove(__dest,__src,__n);
    __dest = local_100;
  }
  local_100 = __dest;
  pFVar5 = (FluxData *)
           (local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
            super__Vector_impl_data._M_finish + -1);
  local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pFVar5;
  if ((FluxData *)
      local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
      super__Vector_impl_data._M_start != pFVar5) {
    pFVar3 = (FluxData *)
             local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pFVar4 = (FluxData *)
               ((long)&(pFVar3->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4);
      datarate_ = *(DataRate *)
                   &(pFVar3->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      pFVar3 = TrackData::flux(trackdata);
      if ((int)datarate_ < 500000) {
        if (datarate_ == _250K) {
          bitcell_ns = 2000;
        }
        else if (datarate_ == _300K) {
          bitcell_ns = 0x683;
        }
        else {
LAB_0013a159:
          bitcell_ns = 0;
        }
      }
      else if (datarate_ == _500K) {
        bitcell_ns = 1000;
      }
      else {
        if (datarate_ != _1M) goto LAB_0013a159;
        bitcell_ns = 500;
      }
      FluxDecoder::FluxDecoder(&local_70,pFVar3,bitcell_ns,opt.scale,4);
      BitBuffer::BitBuffer(&local_d8,datarate_,&local_70);
      TrackData::add(trackdata,&local_d8);
      scan_bitstream_mx(trackdata);
      this = TrackData::track(trackdata);
      bVar2 = Track::empty(this);
      if (local_d8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_d8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d8.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar1 = (void *)CONCAT44(local_d8.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_d8.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_d8.m_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar1);
      }
      pFVar3 = pFVar4;
    } while (bVar2 && pFVar4 != pFVar5);
  }
  if ((FluxData *)
      local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
      super__Vector_impl_data._M_start != (FluxData *)0x0) {
    operator_delete(local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<DataRate,_std::allocator<DataRate>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void scan_flux_mx(TrackData& trackdata, DataRate last_datarate)
{
    std::vector<DataRate> datarates = { last_datarate, DataRate::_250K, DataRate::_300K };
    datarates.erase(std::next(std::find(datarates.rbegin(), datarates.rend(), last_datarate)).base());

    for (auto datarate : datarates)
    {
        FluxDecoder decoder(trackdata.flux(), ::bitcell_ns(datarate), opt.scale);
        BitBuffer bitbuf(datarate, decoder);

        trackdata.add(std::move(bitbuf));
        scan_bitstream_mx(trackdata);

        // If we found something there's no need to check other data rates
        if (!trackdata.track().empty())
            break;
    }
}